

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

void tinyobj::InitMaterial(material_t *material)

{
  long lVar1;
  
  std::__cxx11::string::assign((char *)material);
  std::__cxx11::string::assign((char *)&material->ambient_texname);
  std::__cxx11::string::assign((char *)&material->diffuse_texname);
  std::__cxx11::string::assign((char *)&material->specular_texname);
  std::__cxx11::string::assign((char *)&material->specular_highlight_texname);
  std::__cxx11::string::assign((char *)&material->bump_texname);
  std::__cxx11::string::assign((char *)&material->displacement_texname);
  std::__cxx11::string::assign((char *)&material->alpha_texname);
  for (lVar1 = -0xc; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)material->diffuse + lVar1) = 0;
    *(undefined4 *)((long)material->specular + lVar1) = 0;
    *(undefined4 *)((long)material->transmittance + lVar1) = 0;
    *(undefined4 *)((long)material->emission + lVar1) = 0;
    *(undefined4 *)((long)material->emission + lVar1 + 0xc) = 0;
  }
  material->dissolve = 1.0;
  material->illum = 0;
  material->shininess = 1.0;
  material->ior = 1.0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(material->unknown_parameter)._M_t);
  return;
}

Assistant:

static void InitMaterial(material_t &material) {
  material.name = "";
  material.ambient_texname = "";
  material.diffuse_texname = "";
  material.specular_texname = "";
  material.specular_highlight_texname = "";
  material.bump_texname = "";
  material.displacement_texname = "";
  material.alpha_texname = "";
  for (int i = 0; i < 3; i++) {
    material.ambient[i] = 0.f;
    material.diffuse[i] = 0.f;
    material.specular[i] = 0.f;
    material.transmittance[i] = 0.f;
    material.emission[i] = 0.f;
  }
  material.illum = 0;
  material.dissolve = 1.f;
  material.shininess = 1.f;
  material.ior = 1.f;
  material.unknown_parameter.clear();
}